

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ColumnSetExpr(Parse *pParse,Table *pTab,Column *pCol,Expr *pExpr)

{
  ExprList *pEVar1;
  u16 local_34;
  ExprList *pList;
  Expr *pExpr_local;
  Column *pCol_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  pEVar1 = (pTab->u).tab.pDfltList;
  if (((pCol->iDflt == 0) || (pEVar1 == (ExprList *)0x0)) ||
     (pEVar1->nExpr < (int)(uint)pCol->iDflt)) {
    if (pEVar1 == (ExprList *)0x0) {
      local_34 = 1;
    }
    else {
      local_34 = (short)pEVar1->nExpr + 1;
    }
    pCol->iDflt = local_34;
    pEVar1 = sqlite3ExprListAppend(pParse,pEVar1,pExpr);
    (pTab->u).tab.pDfltList = pEVar1;
  }
  else {
    sqlite3ExprDelete(pParse->db,pEVar1->a[(int)(pCol->iDflt - 1)].pExpr);
    pEVar1->a[(int)(pCol->iDflt - 1)].pExpr = pExpr;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnSetExpr(
  Parse *pParse,    /* Parsing context */
  Table *pTab,      /* The table containing the column */
  Column *pCol,     /* The column to receive the new DEFAULT expression */
  Expr *pExpr       /* The new default expression */
){
  ExprList *pList;
  assert( IsOrdinaryTable(pTab) );
  pList = pTab->u.tab.pDfltList;
  if( pCol->iDflt==0
   || NEVER(pList==0)
   || NEVER(pList->nExpr<pCol->iDflt)
  ){
    pCol->iDflt = pList==0 ? 1 : pList->nExpr+1;
    pTab->u.tab.pDfltList = sqlite3ExprListAppend(pParse, pList, pExpr);
  }else{
    sqlite3ExprDelete(pParse->db, pList->a[pCol->iDflt-1].pExpr);
    pList->a[pCol->iDflt-1].pExpr = pExpr;
  }
}